

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

void armci_stride_info_init
               (stride_info_t *sinfo,void *base_ptr,int stride_levels,int *stride_arr,int *seg_count
               )

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (sinfo == (stride_info_t *)0x0) {
    __assert_fail("sinfo!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x21,
                  "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                 );
  }
  if (stride_levels < 0) {
    __assert_fail("stride_levels>=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x22,
                  "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                 );
  }
  if (8 < stride_levels) {
    __assert_fail("stride_levels<=ARMCI_MAX_STRIDE_LEVEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x23,
                  "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                 );
  }
  if (stride_levels != 0) {
    uVar2 = 0;
    do {
      if (uVar2 == 0) {
        if (*stride_arr < *seg_count) {
          __assert_fail("stride_arr[0] >= seg_count[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                        ,0x26,
                        "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                       );
        }
      }
      else if (stride_arr[uVar2] < seg_count[uVar2] * stride_arr[uVar2 - 1]) {
        __assert_fail("stride_arr[i] >= stride_arr[i-1]*seg_count[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                      ,0x28,
                      "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
                     );
      }
      uVar2 = uVar2 + 1;
    } while ((uint)stride_levels != uVar2);
  }
  sinfo->base_ptr = (char *)base_ptr;
  sinfo->stride_levels = stride_levels;
  if (stride_levels != 0) {
    uVar2 = 1;
    if (1 < stride_levels) {
      uVar2 = (ulong)(uint)stride_levels;
    }
    uVar3 = 0;
    do {
      sinfo->stride_arr[uVar3] = stride_arr[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  uVar2 = 0;
  do {
    sinfo->seg_count[uVar2] = seg_count[uVar2];
    uVar2 = uVar2 + 1;
  } while (stride_levels + 1 != uVar2);
  sinfo->size = 1;
  if (stride_levels != 0) {
    iVar1 = sinfo->size;
    uVar2 = 1;
    if (1 < stride_levels) {
      uVar2 = (ulong)(uint)stride_levels;
    }
    uVar3 = 0;
    do {
      iVar1 = iVar1 * sinfo->seg_count[uVar3 + 1];
      sinfo->size = iVar1;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  if (0 < sinfo->size) {
    sinfo->pos = 0;
    memset(sinfo->itr,0,(ulong)(uint)stride_levels * 4 + 4);
    return;
  }
  __assert_fail("sinfo->size>0",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                ,0x37,
                "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
               );
}

Assistant:

void armci_stride_info_init(stride_info_t *sinfo,
			    void *base_ptr,
			    int stride_levels,
			    const int *stride_arr,
			    const int *seg_count) {
  int i;
  assert(sinfo!=NULL);
  assert(stride_levels>=0);
  assert(stride_levels<=ARMCI_MAX_STRIDE_LEVEL);
  for(i=0; i<stride_levels; i++) {
    if(i==0) 
      assert(stride_arr[0] >= seg_count[0]);
    else 
      assert(stride_arr[i] >= stride_arr[i-1]*seg_count[i]);
  }

  sinfo->base_ptr= base_ptr;
  sinfo->stride_levels = stride_levels;
  for(i=0; i<stride_levels; i++) {
    sinfo->stride_arr[i] = stride_arr[i];
  }
  for(i=0; i<stride_levels+1; i++) {
    sinfo->seg_count[i] = seg_count[i];
  }
  sinfo->size=1;
  for(i=1; i<stride_levels+1; i++) {
    sinfo->size *= sinfo->seg_count[i];
  }
  assert(sinfo->size>0);
  sinfo->pos=0;
  for(i=0; i<stride_levels+1; i++) {
    sinfo->itr[i] = 0;
  }
}